

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ClockingSkewSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ClockingSkewSyntax *this,size_t index)

{
  Token token;
  size_t index_local;
  ClockingSkewSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->edge).kind;
    token._2_1_ = (this->edge).field_0x2;
    token.numFlags.raw = (this->edge).numFlags.raw;
    token.rawLen = (this->edge).rawLen;
    token.info = (this->edge).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->delay->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ClockingSkewSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return edge;
        case 1: return delay;
        default: return nullptr;
    }
}